

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O1

void __thiscall
BasicLoggerTimeFixture_EpochInPST_Test::~BasicLoggerTimeFixture_EpochInPST_Test
          (BasicLoggerTimeFixture_EpochInPST_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (BasicLoggerTimeFixture, EpochInPST) {
    // Pacific Standard Time is 8 hours earlier than Coordinated Universal Time (UTC).
    // Standard time and daylight saving time both apply to this locale.
    // By default, Pacific Daylight Time is one hour ahead of standard time (that is, PDT7).
    // Since it isn't specified, daylight saving time starts on the first Sunday of April at 2:00
    // A.M., and ends on the last Sunday of October at 2:00 A.M.
    time_zone_setter tzs ("PST8PDT");
    std::size_t r =
        pstore::basic_logger::time_string (std::time_t{0}, pstore::gsl::make_span (buffer_));
    EXPECT_EQ (std::size_t{24}, r);
    EXPECT_EQ ('\0', buffer_[24]);
    EXPECT_STREQ ("1969-12-31T16:00:00-0800", buffer_.data ());
}